

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::arg_impl(QString *this,qulonglong a,int fieldWidth,int base,QChar fillChar)

{
  long lVar1;
  QStringView s;
  QStringView s_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  uint flags;
  QLocale locale;
  QString localeArg;
  QString arg;
  ArgEscapeData d;
  QChar *in_stack_fffffffffffffe58;
  QChar *in_stack_fffffffffffffe60;
  QString *in_stack_fffffffffffffe68;
  QStringView *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffec0 [12];
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 *field_width;
  QChar fillChar_00;
  undefined1 *puVar2;
  storage_type_conflict *in_stack_ffffffffffffff98;
  QStringView in_stack_ffffffffffffffb0;
  QStringView in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  s.m_data._4_4_ = in_stack_fffffffffffffecc;
  s._0_12_ = in_stack_fffffffffffffec0;
  findArgEscapes(s);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff9e,L'0');
  ::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  field_width = &DAT_aaaaaaaaaaaaaaaa;
  fillChar_00.ucs = L'ꪪ';
  puVar2 = &DAT_aaaaaaaaaaaaaaaa;
  QString((QString *)0x51c628);
  QString((QString *)0x51c6e6);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  s_00.m_data = in_stack_ffffffffffffff98;
  s_00.m_size = (qsizetype)puVar2;
  replaceArgEscapes(s_00,(ArgEscapeData *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    (qsizetype)field_width,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,
                    fillChar_00);
  ~QString((QString *)0x51c8d3);
  ~QString((QString *)0x51c8e0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QString::arg_impl(qulonglong a, int fieldWidth, int base, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %lld", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags = QLocaleData::ZeroPadded;

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;
        if (!(locale.numberOptions() & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        localeArg = locale.d->m_data->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}